

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O1

ZyanStatus
ZydisFormatterBasePrintAddressREL
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanUSize ZVar1;
  ulong uVar2;
  ZyanUSize ZVar3;
  void *pvVar4;
  ZyanStatus ZVar5;
  ZyanStatus ZVar6;
  ZyanU8 ZVar7;
  ZydisPadding ZVar8;
  ZyanU64 address;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x10a,
                  "ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x10b,
                  "ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0x10c,
                  "ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar5 = ZydisCalcAbsoluteAddress(context->instruction,context->operand,0,&address);
  ZVar6 = ZVar5;
  if (-1 < (int)ZVar5) {
    ZVar8 = formatter->addr_padding_relative;
    if ((ZVar8 == ZYDIS_PADDING_AUTO) &&
       (ZVar8 = ZYDIS_PADDING_DISABLED, formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX)) {
      ZVar7 = context->instruction->address_width;
      if (ZVar7 == '@') {
        ZVar8 = 0x10;
      }
      else if (ZVar7 == ' ') {
        address = address & 0xffffffff;
        ZVar8 = 8;
      }
      else {
        if (ZVar7 != '\x10') {
          return 0x80100004;
        }
        address = address & 0xffff;
        ZVar8 = 4;
      }
    }
    if ((buffer->is_token_list == '\0') ||
       (ZVar6 = ZydisFormatterBufferAppend(buffer,'\t'), -1 < (int)ZVar6)) {
      ZVar7 = (ZyanU8)ZVar8;
      if (formatter->addr_signedness < ZYDIS_SIGNEDNESS_MAX_VALUE) {
        if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
          ZVar6 = ZydisStringAppendHexS
                            (&buffer->string,address,ZVar7,formatter->hex_force_leading_number,
                             formatter->hex_uppercase,'\x01',formatter->number_format[1][0].string,
                             formatter->number_format[1][1].string);
        }
        else {
          if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
            return 0x80100004;
          }
          ZVar6 = ZydisStringAppendDecS
                            (&buffer->string,address,ZVar7,'\x01',
                             formatter->number_format[0][0].string,
                             formatter->number_format[0][1].string);
        }
      }
      else {
        if (formatter->addr_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
          return 0x80100004;
        }
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
          __assert_fail("!destination->vector.allocator",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xeb,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
        ZVar1 = (buffer->string).vector.size;
        if (ZVar1 == 0) {
          __assert_fail("destination->vector.size && source->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xec,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
        uVar2 = (buffer->string).vector.capacity;
        ZVar6 = 0x80100009;
        if (ZVar1 + 1 <= uVar2) {
          *(undefined2 *)((long)(buffer->string).vector.data + (ZVar1 - 1)) = 0x2b;
          ZVar3 = (buffer->string).vector.size;
          pvVar4 = (buffer->string).vector.data;
          (buffer->string).vector.size = ZVar3 + 1;
          ZVar6 = ZVar5;
          if (*(char *)((long)pvVar4 + ZVar3) != '\0') {
            __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                          ,0xf7,
                          "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)"
                         );
          }
        }
        if (uVar2 < ZVar1 + 1) {
          return ZVar6;
        }
        if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
          ZVar6 = ZydisStringAppendHexU
                            (&buffer->string,address,ZVar7,formatter->hex_force_leading_number,
                             formatter->hex_uppercase,formatter->number_format[1][0].string,
                             formatter->number_format[1][1].string);
        }
        else {
          if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
            return 0x80100004;
          }
          ZVar6 = ZydisStringAppendDecU
                            (&buffer->string,address,ZVar7,formatter->number_format[0][0].string,
                             formatter->number_format[0][1].string);
        }
      }
      if (-1 < (int)ZVar6) {
        ZVar6 = 0x100000;
      }
    }
  }
  return ZVar6;
}

Assistant:

ZyanStatus ZydisFormatterBasePrintAddressREL(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZyanU64 address;
    ZYAN_CHECK(ZydisCalcAbsoluteAddress(context->instruction, context->operand, 0, &address));

    ZyanU8 padding = (formatter->addr_padding_relative ==
        ZYDIS_PADDING_AUTO) ? 0 : (ZyanU8)formatter->addr_padding_relative;
    if ((formatter->addr_padding_relative == ZYDIS_PADDING_AUTO) &&
        (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX))
    {
        switch (context->instruction->address_width)
        {
        case 16:
            padding =  4;
            address = (ZyanU16)address;
            break;
        case 32:
            padding =  8;
            address = (ZyanU32)address;
            break;
        case 64:
            padding = 16;
            break;
        default:
            return ZYAN_STATUS_INVALID_ARGUMENT;
        }
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_ADDRESS_REL);
    switch (formatter->addr_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        ZYDIS_STRING_APPEND_NUM_S(formatter, formatter->addr_base, &buffer->string, address,
            padding, formatter->hex_force_leading_number, ZYAN_TRUE);
        break;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        ZYAN_CHECK(ZydisStringAppendShort(&buffer->string, &STR_ADD));
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string, address,
            padding, formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}